

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

void __thiscall Refal2::CVariablesBuilder::Reset(CVariablesBuilder *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  CVariablesBuilder *this_local;
  
  for (local_14 = 0; local_14 < this->firstFreeVariableIndex; local_14 = local_14 + 1) {
    CQualifier::Empty(&this->variables[local_14].Qualifier);
  }
  this->firstFreeVariableIndex = 0;
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    *(undefined4 *)(&(this->super_CErrorsHelper).field_0xa4 + (long)local_18 * 4) = 0xffffffff;
  }
  return;
}

Assistant:

void CVariablesBuilder::Reset()
{
	for( int i = 0; i < firstFreeVariableIndex; i++ ) {
		variables[i].Qualifier.Empty();
	}
	firstFreeVariableIndex = 0;
	for( int i = 0; i < VariableNameToIndexSize; i++ ) {
		variableNameToIndex[i] = InvalidVariableIndex;
	}
}